

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.h
# Opt level: O0

ssize_t bandit::reporter::summary::write(int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  ssize_t sVar4;
  reference pbVar5;
  int in_ECX;
  undefined4 in_register_0000003c;
  int in_R8D;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R9;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  long *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *failure;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  string local_f8 [32];
  reference local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *error;
  const_iterator __end3;
  const_iterator __begin3;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string local_98 [32];
  string local_78 [48];
  string local_48 [32];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *failures_local;
  int specs_skipped_local;
  int specs_succeeded_local;
  int specs_failed_local;
  int specs_run_local;
  ostream *stm_local;
  
  _specs_failed_local = (ostream *)CONCAT44(in_register_0000003c,__fd);
  specs_skipped_local = (int)__n;
  specs_succeeded_local = (int)__buf;
  local_28 = in_R9;
  failures_local._0_4_ = in_R8D;
  failures_local._4_4_ = in_ECX;
  if ((specs_succeeded_local == 0) &&
     (sVar2 = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_stack_00000008), poVar3 = _specs_failed_local, sVar2 == 0)) {
    (**(code **)(*in_stack_00000010 + 0x28))();
    poVar3 = std::operator<<(poVar3,local_48);
    poVar3 = std::operator<<(poVar3,"Could not find any tests.");
    (**(code **)(*in_stack_00000010 + 0x38))(local_78);
    poVar3 = std::operator<<(poVar3,local_78);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_78);
    sVar4 = std::__cxx11::string::~string(local_48);
  }
  else {
    if ((specs_skipped_local == 0) &&
       (sVar2 = std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(in_stack_00000008), poVar3 = _specs_failed_local, sVar2 == 0)) {
      (**(code **)(*in_stack_00000010 + 0x10))();
      poVar3 = std::operator<<(poVar3,local_98);
      poVar3 = std::operator<<(poVar3,"Success!");
      (**(code **)(*in_stack_00000010 + 0x38))(&__range3);
      poVar3 = std::operator<<(poVar3,(string *)&__range3);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&__range3);
      std::__cxx11::string::~string(local_98);
    }
    sVar2 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_stack_00000008);
    if (sVar2 != 0) {
      __end3 = std::__cxx11::
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(in_stack_00000008);
      error = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(in_stack_00000008);
      while (bVar1 = std::operator!=(&__end3,(_Self *)&error), bVar1) {
        local_d8 = std::
                   _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&__end3);
        poVar3 = std::operator<<(_specs_failed_local,(string *)local_d8);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3);
      }
    }
    poVar3 = _specs_failed_local;
    if (0 < specs_skipped_local) {
      (**(code **)(*in_stack_00000010 + 0x28))();
      poVar3 = std::operator<<(poVar3,local_f8);
      poVar3 = std::operator<<(poVar3,"There were failures!");
      (**(code **)(*in_stack_00000010 + 0x38))(&__range3_1);
      poVar3 = std::operator<<(poVar3,(string *)&__range3_1);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&__range3_1);
      std::__cxx11::string::~string(local_f8);
      __end3_1 = std::__cxx11::
                 list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(local_28);
      failure = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::__cxx11::
                list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(local_28);
      while (bVar1 = std::operator!=(&__end3_1,(_Self *)&failure), bVar1) {
        pbVar5 = std::
                 _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end3_1);
        poVar3 = std::operator<<(_specs_failed_local,(string *)pbVar5);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::
        _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3_1);
      }
    }
    poVar3 = std::operator<<(_specs_failed_local,"Test run complete. ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,specs_succeeded_local);
    poVar3 = std::operator<<(poVar3," tests run. ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,failures_local._4_4_);
    std::operator<<(poVar3," succeeded.");
    if (0 < (int)failures_local) {
      poVar3 = std::operator<<(_specs_failed_local," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)failures_local);
      std::operator<<(poVar3," skipped.");
    }
    if (0 < specs_skipped_local) {
      poVar3 = std::operator<<(_specs_failed_local," ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,specs_skipped_local);
      std::operator<<(poVar3," failed.");
    }
    sVar2 = std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_stack_00000008);
    if (sVar2 != 0) {
      poVar3 = std::operator<<(_specs_failed_local," ");
      sVar2 = std::__cxx11::
              list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_stack_00000008);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
      std::operator<<(poVar3," test run errors.");
    }
    sVar4 = std::ostream::operator<<(_specs_failed_local,std::endl<char,std::char_traits<char>>);
  }
  return sVar4;
}

Assistant:

static void write(std::ostream& stm,
          int specs_run, int specs_failed, int specs_succeeded, int specs_skipped,
          const std::list<std::string>& failures, const std::list<std::string>& errors,
          const detail::colorizer_t& colorizer) {
        if (specs_run == 0 && errors.size() == 0) {
          stm << colorizer.bad()
              << "Could not find any tests."
              << colorizer.reset()
              << std::endl;
          return;
        }

        if (specs_failed == 0 && errors.size() == 0) {
          stm << colorizer.good()
              << "Success!"
              << colorizer.reset()
              << std::endl;
        }

        if (errors.size() > 0) {
          for (const auto& error : errors) {
            stm << error << std::endl;
          }
        }

        if (specs_failed > 0) {
          stm << colorizer.bad()
              << "There were failures!"
              << colorizer.reset() << std::endl;
          for (const auto& failure : failures) {
            stm << failure << std::endl;
          }
        }

        stm << "Test run complete. "
            << specs_run << " tests run. "
            << specs_succeeded << " succeeded.";

        if (specs_skipped > 0) {
          stm << " " << specs_skipped << " skipped.";
        }

        if (specs_failed > 0) {
          stm << " " << specs_failed << " failed.";
        }

        if (errors.size() > 0) {
          stm << " " << errors.size() << " test run errors.";
        }

        stm << std::endl;
      }